

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 *puVar1;
  uint *puVar2;
  bool *pbVar3;
  type_conflict5 tVar4;
  double *pdVar5;
  pointer pnVar6;
  undefined8 uVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_02;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_03;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_04;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_05;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_06;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_07;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_20;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar8;
  ulong uVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  n;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ax;
  cpp_dec_float<50U,_int,_void> local_898;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_56;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bx;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_free;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nne;
  multiprecision local_728 [8];
  uint auStack_720 [2];
  uint local_718 [2];
  undefined8 uStack_710;
  undefined8 local_708;
  int local_700;
  undefined1 local_6fc;
  fpclass_type local_6f8;
  int32_t iStack_6f4;
  multiprecision local_6e8 [8];
  uint auStack_6e0 [2];
  uint local_6d8 [2];
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  int local_6c0;
  undefined1 local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  multiprecision local_6a8 [8];
  uint auStack_6a0 [2];
  uint local_698 [2];
  undefined8 uStack_690;
  undefined8 local_688;
  int local_680;
  undefined1 local_67c;
  fpclass_type local_678;
  int32_t iStack_674;
  multiprecision local_668 [8];
  uint auStack_660 [2];
  uint local_658 [2];
  undefined8 uStack_650;
  undefined8 local_648;
  int local_640;
  undefined1 local_63c;
  fpclass_type local_638;
  int32_t iStack_634;
  multiprecision local_628 [8];
  uint auStack_620 [2];
  uint local_618 [2];
  undefined8 uStack_610;
  undefined8 local_608;
  int local_600;
  undefined1 local_5fc;
  fpclass_type local_5f8;
  int32_t iStack_5f4;
  multiprecision local_5e8 [8];
  uint auStack_5e0 [2];
  uint local_5d8 [2];
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  int local_5c0;
  undefined1 local_5bc;
  fpclass_type local_5b8;
  int32_t iStack_5b4;
  multiprecision local_5a8 [8];
  uint auStack_5a0 [2];
  uint local_598 [2];
  undefined8 uStack_590;
  undefined8 local_588;
  int local_580;
  undefined1 local_57c;
  fpclass_type local_578;
  int32_t iStack_574;
  multiprecision local_568 [8];
  uint auStack_560 [2];
  uint local_558 [2];
  undefined8 uStack_550;
  undefined8 local_548;
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  multiprecision local_528 [8];
  uint auStack_520 [2];
  uint local_518 [2];
  undefined8 uStack_510;
  undefined8 local_508;
  int local_500;
  undefined1 local_4fc;
  fpclass_type local_4f8;
  int32_t iStack_4f4;
  multiprecision local_4e8 [8];
  uint auStack_4e0 [2];
  uint local_4d8 [2];
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  int local_4c0;
  undefined1 local_4bc;
  fpclass_type local_4b8;
  int32_t iStack_4b4;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined4 local_480;
  undefined1 local_47c;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined4 local_440;
  undefined1 local_43c;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined4 local_400;
  undefined1 local_3fc;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  undefined1 local_3bc;
  undefined8 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined4 local_380;
  undefined1 local_37c;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined4 local_340;
  undefined1 local_33c;
  undefined8 local_338;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined4 local_300;
  undefined1 local_2fc;
  undefined8 local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined4 local_2c0;
  undefined1 local_2bc;
  undefined8 local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_fixed;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_53;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  r_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_dbl_bounded;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  c_free;
  
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&eps,base);
  lVar8 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_898,1.0,(type *)0x0);
  for (lVar10 = 0;
      lVar10 < (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum; lVar10 = lVar10 + 1) {
    pnVar6 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,*pdVar5,(type *)0x0);
    tVar4 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar6->m_backend).data + lVar8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar4) {
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2c8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x20);
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8);
      local_2e8 = *puVar1;
      uStack_2e0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x10);
      local_2d8 = *puVar1;
      uStack_2d0 = puVar1[1];
      local_2c0 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x28);
      local_2bc = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x2c);
      local_2b8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x30);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&bx,(multiprecision *)&local_2e8,arg);
      tVar4 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_898);
      if (tVar4) {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_308 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x20);
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8);
        local_328 = *puVar1;
        uStack_320 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x10);
        local_318 = *puVar1;
        uStack_310 = puVar1[1];
        local_300 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x28);
        local_2fc = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x2c);
        local_2f8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x30);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&ax.m_backend,(multiprecision *)&local_328,arg_00);
        local_898.data._M_elems[4] = ax.m_backend.data._M_elems[4];
        local_898.data._M_elems[5] = ax.m_backend.data._M_elems[5];
        local_898.data._M_elems[0] = ax.m_backend.data._M_elems[0];
        local_898.data._M_elems[1] = ax.m_backend.data._M_elems[1];
        local_898.data._M_elems[2] = ax.m_backend.data._M_elems[2];
        local_898.data._M_elems[3] = ax.m_backend.data._M_elems[3];
        local_898.exp = ax.m_backend.exp;
        local_898.neg = ax.m_backend.neg;
        local_898.fpclass = ax.m_backend.fpclass;
        local_898.prec_elem = ax.m_backend.prec_elem;
      }
    }
    pnVar6 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,-*pdVar5,(type *)0x0);
    tVar4 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar6->m_backend).data + lVar8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar4) {
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_348 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x20);
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8);
      local_368 = *puVar1;
      uStack_360 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x10);
      local_358 = *puVar1;
      uStack_350 = puVar1[1];
      local_340 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x28);
      local_33c = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x2c);
      local_338 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x30);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&bx,(multiprecision *)&local_368,arg_01);
      tVar4 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_898);
      if (tVar4) {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_388 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x20);
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8);
        local_3a8 = *puVar1;
        uStack_3a0 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x10);
        local_398 = *puVar1;
        uStack_390 = puVar1[1];
        local_380 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x28);
        local_37c = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x2c);
        local_378 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + 0x30);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&ax.m_backend,(multiprecision *)&local_3a8,arg_02);
        local_898.data._M_elems[4] = ax.m_backend.data._M_elems[4];
        local_898.data._M_elems[5] = ax.m_backend.data._M_elems[5];
        local_898.data._M_elems[0] = ax.m_backend.data._M_elems[0];
        local_898.data._M_elems[1] = ax.m_backend.data._M_elems[1];
        local_898.data._M_elems[2] = ax.m_backend.data._M_elems[2];
        local_898.data._M_elems[3] = ax.m_backend.data._M_elems[3];
        local_898.exp = ax.m_backend.exp;
        local_898.neg = ax.m_backend.neg;
        local_898.fpclass = ax.m_backend.fpclass;
        local_898.prec_elem = ax.m_backend.prec_elem;
      }
    }
    lVar8 = lVar8 + 0x38;
  }
  lVar10 = 0;
  for (lVar8 = 0;
      lVar8 < (base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum; lVar8 = lVar8 + 1) {
    pnVar6 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,*pdVar5,(type *)0x0);
    tVar4 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar6->m_backend).data + lVar10),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar4) {
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_3c8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x20);
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10);
      local_3e8 = *puVar1;
      uStack_3e0 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x10);
      local_3d8 = *puVar1;
      uStack_3d0 = puVar1[1];
      local_3c0 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x28);
      local_3bc = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x2c);
      local_3b8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x30);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&bx,(multiprecision *)&local_3e8,arg_03);
      tVar4 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_898);
      if (tVar4) {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_408 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x20);
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10);
        local_428 = *puVar1;
        uStack_420 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x10);
        local_418 = *puVar1;
        uStack_410 = puVar1[1];
        local_400 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x28);
        local_3fc = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x2c);
        local_3f8 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x30);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&ax.m_backend,(multiprecision *)&local_428,arg_04);
        local_898.data._M_elems[4] = ax.m_backend.data._M_elems[4];
        local_898.data._M_elems[5] = ax.m_backend.data._M_elems[5];
        local_898.data._M_elems[0] = ax.m_backend.data._M_elems[0];
        local_898.data._M_elems[1] = ax.m_backend.data._M_elems[1];
        local_898.data._M_elems[2] = ax.m_backend.data._M_elems[2];
        local_898.data._M_elems[3] = ax.m_backend.data._M_elems[3];
        local_898.exp = ax.m_backend.exp;
        local_898.neg = ax.m_backend.neg;
        local_898.fpclass = ax.m_backend.fpclass;
        local_898.prec_elem = ax.m_backend.prec_elem;
      }
    }
    pnVar6 = (base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&ax.m_backend,-*pdVar5,(type *)0x0);
    tVar4 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)&(pnVar6->m_backend).data + lVar10),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ax.m_backend);
    if (tVar4) {
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_448 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x20);
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10);
      local_468 = *puVar1;
      uStack_460 = puVar1[1];
      puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x10);
      local_458 = *puVar1;
      uStack_450 = puVar1[1];
      local_440 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x28);
      local_43c = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x2c);
      local_438 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x30);
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&bx,(multiprecision *)&local_468,arg_05);
      tVar4 = boost::multiprecision::operator>
                        (&bx,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_898);
      if (tVar4) {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_488 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x20);
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10);
        local_4a8 = *puVar1;
        uStack_4a0 = puVar1[1];
        puVar1 = (undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x10);
        local_498 = *puVar1;
        uStack_490 = puVar1[1];
        local_480 = *(undefined4 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x28);
        local_47c = *(undefined1 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x2c);
        local_478 = *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar10 + 0x30);
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&ax.m_backend,(multiprecision *)&local_4a8,arg_06);
        local_898.data._M_elems[4] = ax.m_backend.data._M_elems[4];
        local_898.data._M_elems[5] = ax.m_backend.data._M_elems[5];
        local_898.data._M_elems[0] = ax.m_backend.data._M_elems[0];
        local_898.data._M_elems[1] = ax.m_backend.data._M_elems[1];
        local_898.data._M_elems[2] = ax.m_backend.data._M_elems[2];
        local_898.data._M_elems[3] = ax.m_backend.data._M_elems[3];
        local_898.exp = ax.m_backend.exp;
        local_898.neg = ax.m_backend.neg;
        local_898.fpclass = ax.m_backend.fpclass;
        local_898.prec_elem = ax.m_backend.prec_elem;
      }
    }
    lVar10 = lVar10 + 0x38;
  }
  this_00 = &(base->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .object;
  if (base->theType * base->theRep < 1) {
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0x3ff00000;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&bx.m_backend,this_00);
    ax.m_backend.fpclass = cpp_dec_float_finite;
    ax.m_backend.prec_elem = 10;
    ax.m_backend.data._M_elems[0] = 0;
    ax.m_backend.data._M_elems[1] = 0;
    ax.m_backend.data._M_elems[2] = 0;
    ax.m_backend.data._M_elems[3] = 0;
    ax.m_backend.data._M_elems[4] = 0;
    ax.m_backend.data._M_elems[5] = 0;
    ax.m_backend.data._M_elems._24_5_ = 0;
    ax.m_backend.data._M_elems[7]._1_3_ = 0;
    ax.m_backend.data._M_elems._32_5_ = 0;
    ax.m_backend.data._M_elems[9]._1_3_ = 0;
    ax.m_backend.exp = 0;
    ax.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&ax.m_backend,(double *)&nne,&bx.m_backend);
    nne.m_backend.data._M_elems[0] = 0x47ae147b;
    nne.m_backend.data._M_elems[1] = 0x3f847ae1;
    bx.m_backend.fpclass = cpp_dec_float_finite;
    bx.m_backend.prec_elem = 10;
    bx.m_backend.data._M_elems[0] = 0;
    bx.m_backend.data._M_elems[1] = 0;
    bx.m_backend.data._M_elems[2] = 0;
    bx.m_backend.data._M_elems[3] = 0;
    bx.m_backend.data._M_elems[4] = 0;
    bx.m_backend.data._M_elems[5] = 0;
    bx.m_backend.data._M_elems._24_5_ = 0;
    bx.m_backend.data._M_elems[7]._1_3_ = 0;
    bx.m_backend.data._M_elems._32_5_ = 0;
    bx.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&bx.m_backend,(double *)&nne,&local_898);
    c_fixed.m_backend.data._M_elems[0] = 0xeb1c432d;
    c_fixed.m_backend.data._M_elems[1] = 0x3f1a36e2;
    nne.m_backend.fpclass = cpp_dec_float_finite;
    nne.m_backend.prec_elem = 10;
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0;
    nne.m_backend.data._M_elems[2] = 0;
    nne.m_backend.data._M_elems[3] = 0;
    nne.m_backend.data._M_elems[4] = 0;
    nne.m_backend.data._M_elems[5] = 0;
    nne.m_backend.data._M_elems._24_5_ = 0;
    nne.m_backend.data._M_elems[7]._1_3_ = 0;
    nne.m_backend.data._M_elems._32_5_ = 0;
    nne.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&nne.m_backend,&bx.m_backend,(double *)&c_fixed);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_fixed.m_backend,100000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&r_fixed.m_backend,10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&c_dbl_bounded.m_backend,1,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&r_dbl_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&c_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&r_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_free.m_backend,-10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&r_free.m_backend,-100000.0,(type *)0x0);
    uVar9 = (ulong)(uint)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    lVar8 = uVar9 * 0x38;
    while( true ) {
      if ((int)uVar9 < 1) break;
      x.m_backend.data._M_elems._0_8_ =
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar9 - 1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused + -1;
      n.m_backend.fpclass = cpp_dec_float_finite;
      n.m_backend.prec_elem = 10;
      n.m_backend.data._M_elems[0] = 0;
      n.m_backend.data._M_elems[1] = 0;
      n.m_backend.data._M_elems[2] = 0;
      n.m_backend.data._M_elems[3] = 0;
      n.m_backend.data._M_elems[4] = 0;
      n.m_backend.data._M_elems[5] = 0;
      n.m_backend.data._M_elems._24_5_ = 0;
      n.m_backend.data._M_elems[7]._1_3_ = 0;
      n.m_backend.data._M_elems._32_5_ = 0;
      n.m_backend.data._M_elems[9]._1_3_ = 0;
      n.m_backend.exp = 0;
      n.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&n.m_backend,&nne.m_backend,(longlong *)&x.m_backend);
      x.m_backend.fpclass = cpp_dec_float_finite;
      x.m_backend.prec_elem = 10;
      x.m_backend.data._M_elems[0] = 0;
      x.m_backend.data._M_elems[1] = 0;
      x.m_backend.data._M_elems[2] = 0;
      x.m_backend.data._M_elems[3] = 0;
      x.m_backend.data._M_elems[4] = 0;
      x.m_backend.data._M_elems[5] = 0;
      x.m_backend.data._M_elems._24_5_ = 0;
      x.m_backend.data._M_elems[7]._1_3_ = 0;
      x.m_backend.data._M_elems._32_5_ = 0;
      x.m_backend.data._M_elems[9]._1_3_ = 0;
      x.m_backend.exp = 0;
      x.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&x.m_backend,&ax.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_4.m_backend,&bx.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 10;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems._24_5_ = 0;
      result_5.m_backend.data._M_elems[7]._1_3_ = 0;
      result_5.m_backend.data._M_elems._32_5_ = 0;
      result_5.m_backend.data._M_elems[9]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_5.m_backend,&bx.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar5,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar6[-1].m_backend.data + lVar8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar4) {
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 10;
        result_30.m_backend.data._M_elems[0] = 0;
        result_30.m_backend.data._M_elems[1] = 0;
        result_30.m_backend.data._M_elems[2] = 0;
        result_30.m_backend.data._M_elems[3] = 0;
        result_30.m_backend.data._M_elems[4] = 0;
        result_30.m_backend.data._M_elems[5] = 0;
        result_30.m_backend.data._M_elems._24_5_ = 0;
        result_30.m_backend.data._M_elems[7]._1_3_ = 0;
        result_30.m_backend.data._M_elems._32_5_ = 0;
        result_30.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_30.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&result_9.m_backend,(multiprecision *)&result_30.m_backend,arg_15);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend,&eps);
        if (tVar4) {
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&c_fixed.m_backend,&n.m_backend);
          uStack_650 = CONCAT35(x.m_backend.data._M_elems[7]._1_3_,x.m_backend.data._M_elems._24_5_)
          ;
          local_668 = (multiprecision  [8])x.m_backend.data._M_elems._0_8_;
          auStack_660[0] = x.m_backend.data._M_elems[2];
          auStack_660[1] = x.m_backend.data._M_elems[3];
          local_658[0] = x.m_backend.data._M_elems[4];
          local_658[1] = x.m_backend.data._M_elems[5];
          local_648 = CONCAT35(x.m_backend.data._M_elems[9]._1_3_,x.m_backend.data._M_elems._32_5_);
          local_640 = x.m_backend.exp;
          local_63c = x.m_backend.neg;
          local_638 = x.m_backend.fpclass;
          iStack_634 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_8.m_backend,local_668,arg_16);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 10;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems._24_5_ = 0;
          result_9.m_backend.data._M_elems[7]._1_3_ = 0;
          result_9.m_backend.data._M_elems._32_5_ = 0;
          result_9.m_backend.data._M_elems[9]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_9.m_backend,&result_7.m_backend,&result_8.m_backend);
LAB_002a5a30:
          pnVar6 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                        result_9.m_backend.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                        result_9.m_backend.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_9.m_backend._48_8_;
        }
        else {
          pnVar6 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_9.m_backend,-*pdVar5,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar6[-1].m_backend.data + lVar8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_9.m_backend);
          if (tVar4) {
            result_9.m_backend.data._M_elems._0_8_ =
                 result_9.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar4 = boost::multiprecision::operator>(&x,(int *)&result_9.m_backend);
            if (!tVar4) {
              result_8.m_backend.fpclass = cpp_dec_float_finite;
              result_8.m_backend.prec_elem = 10;
              result_8.m_backend.data._M_elems[0] = 0;
              result_8.m_backend.data._M_elems[1] = 0;
              result_8.m_backend.data._M_elems[2] = 0;
              result_8.m_backend.data._M_elems[3] = 0;
              result_8.m_backend.data._M_elems[4] = 0;
              result_8.m_backend.data._M_elems[5] = 0;
              result_8.m_backend.data._M_elems._24_5_ = 0;
              result_8.m_backend.data._M_elems[7]._1_3_ = 0;
              result_8.m_backend.data._M_elems._32_5_ = 0;
              result_8.m_backend._37_8_ = 0;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_8.m_backend,&c_dbl_bounded.m_backend,&x.m_backend);
              result_7.m_backend.fpclass = cpp_dec_float_finite;
              result_7.m_backend.prec_elem = 10;
              result_7.m_backend.data._M_elems[0] = 0;
              result_7.m_backend.data._M_elems[1] = 0;
              result_7.m_backend.data._M_elems[2] = 0;
              result_7.m_backend.data._M_elems[3] = 0;
              result_7.m_backend.data._M_elems[4] = 0;
              result_7.m_backend.data._M_elems[5] = 0;
              result_7.m_backend.data._M_elems._24_5_ = 0;
              result_7.m_backend.data._M_elems[7]._1_3_ = 0;
              result_7.m_backend.data._M_elems._32_5_ = 0;
              result_7.m_backend.data._M_elems[9]._1_3_ = 0;
              result_7.m_backend.exp = 0;
              result_7.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_7.m_backend,&result_8.m_backend,&result_5.m_backend);
              goto LAB_002a57fb;
            }
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&c_dbl_bounded.m_backend,&x.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 10;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems._24_5_ = 0;
            result_7.m_backend.data._M_elems[7]._1_3_ = 0;
            result_7.m_backend.data._M_elems._32_5_ = 0;
            result_7.m_backend.data._M_elems[9]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_7.m_backend,&result_8.m_backend,&result_4.m_backend);
          }
          else {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&c_bounded.m_backend,&result_4.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 10;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems._24_5_ = 0;
            result_7.m_backend.data._M_elems[7]._1_3_ = 0;
            result_7.m_backend.data._M_elems._32_5_ = 0;
            result_7.m_backend.data._M_elems[9]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_7.m_backend,&result_8.m_backend,&x.m_backend);
          }
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 10;
          result_9.m_backend.neg = false;
          result_9.m_backend.exp = 0;
          result_9.m_backend.data._M_elems[9]._1_3_ = 0;
          result_9.m_backend.data._M_elems._32_5_ = 0;
          result_9.m_backend.data._M_elems[7]._1_3_ = 0;
          result_9.m_backend.data._M_elems._24_5_ = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_9.m_backend,&result_7.m_backend,&n.m_backend);
          pnVar6 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                        result_9.m_backend.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                        result_9.m_backend.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_9.m_backend._48_8_;
          (this->colUp).data[uVar9 - 1] = true;
        }
      }
      else {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_9.m_backend,-*pdVar5,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar6[-1].m_backend.data + lVar8),&result_9);
        if (!tVar4) {
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&c_free.m_backend,&n.m_backend);
          uStack_690 = CONCAT35(x.m_backend.data._M_elems[7]._1_3_,x.m_backend.data._M_elems._24_5_)
          ;
          local_6a8 = (multiprecision  [8])x.m_backend.data._M_elems._0_8_;
          auStack_6a0[0] = x.m_backend.data._M_elems[2];
          auStack_6a0[1] = x.m_backend.data._M_elems[3];
          local_698[0] = x.m_backend.data._M_elems[4];
          local_698[1] = x.m_backend.data._M_elems[5];
          local_688 = CONCAT35(x.m_backend.data._M_elems[9]._1_3_,x.m_backend.data._M_elems._32_5_);
          local_680 = x.m_backend.exp;
          local_67c = x.m_backend.neg;
          local_678 = x.m_backend.fpclass;
          iStack_674 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_8.m_backend,local_6a8,arg_17);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 10;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems._24_5_ = 0;
          result_9.m_backend.data._M_elems[7]._1_3_ = 0;
          result_9.m_backend.data._M_elems._32_5_ = 0;
          result_9.m_backend.data._M_elems[9]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_9.m_backend,&result_7.m_backend,&result_8.m_backend);
          goto LAB_002a5a30;
        }
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 10;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems._24_5_ = 0;
        result_8.m_backend.data._M_elems[7]._1_3_ = 0;
        result_8.m_backend.data._M_elems._32_5_ = 0;
        result_8.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_8.m_backend,&c_bounded.m_backend,&x.m_backend);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 10;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems._24_5_ = 0;
        result_7.m_backend.data._M_elems[7]._1_3_ = 0;
        result_7.m_backend.data._M_elems._32_5_ = 0;
        result_7.m_backend.data._M_elems[9]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_7.m_backend,&result_8.m_backend,&result_5.m_backend);
LAB_002a57fb:
        result_9.m_backend.neg = false;
        result_9.m_backend.exp = 0;
        result_9.m_backend.data._M_elems[9]._1_3_ = 0;
        result_9.m_backend.data._M_elems._32_5_ = 0;
        result_9.m_backend.data._M_elems[7]._1_3_ = 0;
        result_9.m_backend.data._M_elems._24_5_ = 0;
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 10;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_9.m_backend,&result_7.m_backend,&n.m_backend);
        pnVar6 = (this->colWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
             CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                      result_9.m_backend.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
        *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                      result_9.m_backend.data._M_elems._24_5_);
        puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
        *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
        *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_9.m_backend._48_8_;
        (this->colUp).data[uVar9 - 1] = false;
      }
      lVar8 = lVar8 + -0x38;
      uVar9 = uVar9 - 1;
    }
    uVar9 = (ulong)(uint)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    lVar8 = uVar9 * 0x38;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&n.m_backend,1,(type *)0x0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&x.m_backend,0,(type *)0x0);
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 10;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems._24_5_ = 0;
      result_5.m_backend.data._M_elems[7]._1_3_ = 0;
      result_5.m_backend.data._M_elems._32_5_ = 0;
      result_5.m_backend.data._M_elems[9]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_5.m_backend,&bx.m_backend,&n.m_backend);
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_4.m_backend,&result_5.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_9.m_backend.fpclass = cpp_dec_float_finite;
      result_9.m_backend.prec_elem = 10;
      result_9.m_backend.data._M_elems[0] = 0;
      result_9.m_backend.data._M_elems[1] = 0;
      result_9.m_backend.data._M_elems[2] = 0;
      result_9.m_backend.data._M_elems[3] = 0;
      result_9.m_backend.data._M_elems[4] = 0;
      result_9.m_backend.data._M_elems[5] = 0;
      result_9.m_backend.data._M_elems._24_5_ = 0;
      result_9.m_backend.data._M_elems[7]._1_3_ = 0;
      result_9.m_backend.data._M_elems._32_5_ = 0;
      result_9.m_backend.data._M_elems[9]._1_3_ = 0;
      result_9.m_backend.exp = 0;
      result_9.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_9.m_backend,&bx.m_backend,&n.m_backend);
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 10;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems._24_5_ = 0;
      result_5.m_backend.data._M_elems[7]._1_3_ = 0;
      result_5.m_backend.data._M_elems._32_5_ = 0;
      result_5.m_backend.data._M_elems[9]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_5.m_backend,&result_9.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 10;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems._24_5_ = 0;
      result_7.m_backend.data._M_elems[7]._1_3_ = 0;
      result_7.m_backend.data._M_elems._32_5_ = 0;
      result_7.m_backend.data._M_elems[9]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_7.m_backend,&ax.m_backend,&n.m_backend);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&result_8.m_backend,this_00,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                     (base->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thekey[uVar9 - 1].idx));
      result_9.m_backend.fpclass = cpp_dec_float_finite;
      result_9.m_backend.prec_elem = 10;
      result_9.m_backend.data._M_elems[0] = 0;
      result_9.m_backend.data._M_elems[1] = 0;
      result_9.m_backend.data._M_elems[2] = 0;
      result_9.m_backend.data._M_elems[3] = 0;
      result_9.m_backend.data._M_elems[4] = 0;
      result_9.m_backend.data._M_elems[5] = 0;
      result_9.m_backend.data._M_elems._24_5_ = 0;
      result_9.m_backend.data._M_elems[7]._1_3_ = 0;
      result_9.m_backend.data._M_elems._32_5_ = 0;
      result_9.m_backend.data._M_elems[9]._1_3_ = 0;
      result_9.m_backend.exp = 0;
      result_9.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_9.m_backend,&result_7.m_backend,&result_8.m_backend);
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_7.m_backend,*pdVar5,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar6[-1].m_backend.data + lVar8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_7.m_backend);
      if (tVar4) {
        result_53.m_backend.fpclass = cpp_dec_float_finite;
        result_53.m_backend.prec_elem = 10;
        result_53.m_backend.data._M_elems[0] = 0;
        result_53.m_backend.data._M_elems[1] = 0;
        result_53.m_backend.data._M_elems[2] = 0;
        result_53.m_backend.data._M_elems[3] = 0;
        result_53.m_backend.data._M_elems[4] = 0;
        result_53.m_backend.data._M_elems[5] = 0;
        result_53.m_backend.data._M_elems._24_5_ = 0;
        result_53.m_backend.data._M_elems[7]._1_3_ = 0;
        result_53.m_backend.data._M_elems._32_5_ = 0;
        result_53.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_53.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&result_7.m_backend,(multiprecision *)&result_53.m_backend,arg_18);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_7.m_backend,&eps);
        if (tVar4) {
          result_8.m_backend.fpclass = cpp_dec_float_finite;
          result_8.m_backend.prec_elem = 10;
          result_8.m_backend.data._M_elems[0] = 0;
          result_8.m_backend.data._M_elems[1] = 0;
          result_8.m_backend.data._M_elems[2] = 0;
          result_8.m_backend.data._M_elems[3] = 0;
          result_8.m_backend.data._M_elems[4] = 0;
          result_8.m_backend.data._M_elems[5] = 0;
          result_8.m_backend.data._M_elems._24_5_ = 0;
          result_8.m_backend.data._M_elems[7]._1_3_ = 0;
          result_8.m_backend.data._M_elems._32_5_ = 0;
          result_8.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_8.m_backend,&r_fixed.m_backend,&x.m_backend);
          uStack_6d0 = CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                                result_9.m_backend.data._M_elems._24_5_);
          local_6e8 = (multiprecision  [8])result_9.m_backend.data._M_elems._0_8_;
          auStack_6e0[0] = result_9.m_backend.data._M_elems[2];
          auStack_6e0[1] = result_9.m_backend.data._M_elems[3];
          local_6d8[0] = result_9.m_backend.data._M_elems[4];
          local_6d8[1] = result_9.m_backend.data._M_elems[5];
          local_6c8 = CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                               result_9.m_backend.data._M_elems._32_5_);
          local_6c0 = result_9.m_backend.exp;
          local_6bc = result_9.m_backend.neg;
          local_6b8 = result_9.m_backend.fpclass;
          iStack_6b4 = result_9.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_56.m_backend,local_6e8,arg_19);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&result_8.m_backend,&result_56.m_backend);
LAB_002a627a:
          pnVar6 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               CONCAT35(result_7.m_backend.data._M_elems[9]._1_3_,
                        result_7.m_backend.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_7.m_backend.data._M_elems[7]._1_3_,
                        result_7.m_backend.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result_7.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_7.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_7.m_backend.neg;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_7.m_backend._48_8_;
        }
        else {
          pnVar6 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_7.m_backend,-*pdVar5,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar6[-1].m_backend.data + lVar8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_7.m_backend);
          if (tVar4) {
            result_7.m_backend.data._M_elems._0_8_ =
                 result_7.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
            tVar4 = boost::multiprecision::operator>(&result_9,(int *)&result_7.m_backend);
            if (!tVar4) {
              result_56.m_backend.fpclass = cpp_dec_float_finite;
              result_56.m_backend.prec_elem = 10;
              result_56.m_backend.data._M_elems[0] = 0;
              result_56.m_backend.data._M_elems[1] = 0;
              result_56.m_backend.data._M_elems[2] = 0;
              result_56.m_backend.data._M_elems[3] = 0;
              result_56.m_backend.data._M_elems[4] = 0;
              result_56.m_backend.data._M_elems[5] = 0;
              result_56.m_backend.data._M_elems._24_5_ = 0;
              result_56.m_backend.data._M_elems[7]._1_3_ = 0;
              result_56.m_backend.data._M_elems._32_5_ = 0;
              result_56.m_backend._37_8_ = 0;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_56.m_backend,&r_dbl_bounded.m_backend,&result_9.m_backend);
              result_8.m_backend.fpclass = cpp_dec_float_finite;
              result_8.m_backend.prec_elem = 10;
              result_8.m_backend.data._M_elems[0] = 0;
              result_8.m_backend.data._M_elems[1] = 0;
              result_8.m_backend.data._M_elems[2] = 0;
              result_8.m_backend.data._M_elems[3] = 0;
              result_8.m_backend.data._M_elems[4] = 0;
              result_8.m_backend.data._M_elems[5] = 0;
              result_8.m_backend.data._M_elems._24_5_ = 0;
              result_8.m_backend.data._M_elems[7]._1_3_ = 0;
              result_8.m_backend.data._M_elems._32_5_ = 0;
              result_8.m_backend._37_8_ = 0;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_8.m_backend,&result_56.m_backend,&result_5.m_backend);
              result_7.m_backend.fpclass = cpp_dec_float_finite;
              result_7.m_backend.prec_elem = 10;
              result_7.m_backend.data._M_elems[0] = 0;
              result_7.m_backend.data._M_elems[1] = 0;
              result_7.m_backend.data._M_elems[2] = 0;
              result_7.m_backend.data._M_elems[3] = 0;
              result_7.m_backend.data._M_elems[4] = 0;
              result_7.m_backend.data._M_elems[5] = 0;
              result_7.m_backend.data._M_elems._24_5_ = 0;
              result_7.m_backend.data._M_elems[7]._1_3_ = 0;
              result_7.m_backend.data._M_elems._32_5_ = 0;
              result_7.m_backend.data._M_elems[9]._1_3_ = 0;
              result_7.m_backend.exp = 0;
              result_7.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&result_7.m_backend,&result_8.m_backend,&x.m_backend);
              goto LAB_002a604a;
            }
            result_56.m_backend.fpclass = cpp_dec_float_finite;
            result_56.m_backend.prec_elem = 10;
            result_56.m_backend.data._M_elems[0] = 0;
            result_56.m_backend.data._M_elems[1] = 0;
            result_56.m_backend.data._M_elems[2] = 0;
            result_56.m_backend.data._M_elems[3] = 0;
            result_56.m_backend.data._M_elems[4] = 0;
            result_56.m_backend.data._M_elems[5] = 0;
            result_56.m_backend.data._M_elems._24_5_ = 0;
            result_56.m_backend.data._M_elems[7]._1_3_ = 0;
            result_56.m_backend.data._M_elems._32_5_ = 0;
            result_56.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_56.m_backend,&r_dbl_bounded.m_backend,&result_9.m_backend);
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&result_56.m_backend,&result_4.m_backend);
            v = &x.m_backend;
          }
          else {
            result_56.m_backend.fpclass = cpp_dec_float_finite;
            result_56.m_backend.prec_elem = 10;
            result_56.m_backend.data._M_elems[0] = 0;
            result_56.m_backend.data._M_elems[1] = 0;
            result_56.m_backend.data._M_elems[2] = 0;
            result_56.m_backend.data._M_elems[3] = 0;
            result_56.m_backend.data._M_elems[4] = 0;
            result_56.m_backend.data._M_elems[5] = 0;
            result_56.m_backend.data._M_elems._24_5_ = 0;
            result_56.m_backend.data._M_elems[7]._1_3_ = 0;
            result_56.m_backend.data._M_elems._32_5_ = 0;
            result_56.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_56.m_backend,&r_bounded.m_backend,&result_4.m_backend);
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&result_56.m_backend,&x.m_backend);
            v = &result_9.m_backend;
          }
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.neg = false;
          result_7.m_backend.exp = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&result_8.m_backend,v);
          pnVar6 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               CONCAT35(result_7.m_backend.data._M_elems[9]._1_3_,
                        result_7.m_backend.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_7.m_backend.data._M_elems[7]._1_3_,
                        result_7.m_backend.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result_7.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_7.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_7.m_backend.neg;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_7.m_backend._48_8_;
          (this->rowRight).data[uVar9 - 1] = true;
        }
      }
      else {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_7.m_backend,-*pdVar5,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar6[-1].m_backend.data + lVar8),&result_7);
        if (!tVar4) {
          result_8.m_backend.fpclass = cpp_dec_float_finite;
          result_8.m_backend.prec_elem = 10;
          result_8.m_backend.data._M_elems[0] = 0;
          result_8.m_backend.data._M_elems[1] = 0;
          result_8.m_backend.data._M_elems[2] = 0;
          result_8.m_backend.data._M_elems[3] = 0;
          result_8.m_backend.data._M_elems[4] = 0;
          result_8.m_backend.data._M_elems[5] = 0;
          result_8.m_backend.data._M_elems._24_5_ = 0;
          result_8.m_backend.data._M_elems[7]._1_3_ = 0;
          result_8.m_backend.data._M_elems._32_5_ = 0;
          result_8.m_backend._37_8_ = 0;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_8.m_backend,&r_free.m_backend,&x.m_backend);
          uStack_710 = CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                                result_9.m_backend.data._M_elems._24_5_);
          local_728 = (multiprecision  [8])result_9.m_backend.data._M_elems._0_8_;
          auStack_720[0] = result_9.m_backend.data._M_elems[2];
          auStack_720[1] = result_9.m_backend.data._M_elems[3];
          local_718[0] = result_9.m_backend.data._M_elems[4];
          local_718[1] = result_9.m_backend.data._M_elems[5];
          local_708 = CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                               result_9.m_backend.data._M_elems._32_5_);
          local_700 = result_9.m_backend.exp;
          local_6fc = result_9.m_backend.neg;
          local_6f8 = result_9.m_backend.fpclass;
          iStack_6f4 = result_9.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_56.m_backend,local_728,arg_20);
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&result_8.m_backend,&result_56.m_backend);
          goto LAB_002a627a;
        }
        result_56.m_backend.fpclass = cpp_dec_float_finite;
        result_56.m_backend.prec_elem = 10;
        result_56.m_backend.data._M_elems[0] = 0;
        result_56.m_backend.data._M_elems[1] = 0;
        result_56.m_backend.data._M_elems[2] = 0;
        result_56.m_backend.data._M_elems[3] = 0;
        result_56.m_backend.data._M_elems[4] = 0;
        result_56.m_backend.data._M_elems[5] = 0;
        result_56.m_backend.data._M_elems._24_5_ = 0;
        result_56.m_backend.data._M_elems[7]._1_3_ = 0;
        result_56.m_backend.data._M_elems._32_5_ = 0;
        result_56.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_56.m_backend,&r_bounded.m_backend,&result_5.m_backend);
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 10;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems._24_5_ = 0;
        result_8.m_backend.data._M_elems[7]._1_3_ = 0;
        result_8.m_backend.data._M_elems._32_5_ = 0;
        result_8.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_8.m_backend,&result_56.m_backend,&x.m_backend);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 10;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems._24_5_ = 0;
        result_7.m_backend.data._M_elems[7]._1_3_ = 0;
        result_7.m_backend.data._M_elems._32_5_ = 0;
        result_7.m_backend.data._M_elems[9]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_7.m_backend,&result_8.m_backend,&result_9.m_backend);
LAB_002a604a:
        pnVar6 = (this->rowWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
             CONCAT35(result_7.m_backend.data._M_elems[9]._1_3_,
                      result_7.m_backend.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
        *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result_7.m_backend.data._M_elems[7]._1_3_,
                      result_7.m_backend.data._M_elems._24_5_);
        puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
        *(undefined8 *)puVar2 = result_7.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result_7.m_backend.data._M_elems._8_8_;
        *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_7.m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_7.m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_7.m_backend._48_8_;
        (this->rowRight).data[uVar9 - 1] = false;
      }
      lVar8 = lVar8 + -0x38;
    }
  }
  else {
    nne.m_backend.data._M_elems[0] = 0xd2f1a9fc;
    nne.m_backend.data._M_elems[1] = 0x3f50624d;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::maxAbs((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&bx.m_backend,this_00);
    ax.m_backend.fpclass = cpp_dec_float_finite;
    ax.m_backend.prec_elem = 10;
    ax.m_backend.data._M_elems[0] = 0;
    ax.m_backend.data._M_elems[1] = 0;
    ax.m_backend.data._M_elems[2] = 0;
    ax.m_backend.data._M_elems[3] = 0;
    ax.m_backend.data._M_elems[4] = 0;
    ax.m_backend.data._M_elems[5] = 0;
    ax.m_backend.data._M_elems._24_5_ = 0;
    ax.m_backend.data._M_elems[7]._1_3_ = 0;
    ax.m_backend.data._M_elems._32_5_ = 0;
    ax.m_backend.data._M_elems[9]._1_3_ = 0;
    ax.m_backend.exp = 0;
    ax.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&ax.m_backend,(double *)&nne,&bx.m_backend);
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0x3ff00000;
    bx.m_backend.fpclass = cpp_dec_float_finite;
    bx.m_backend.prec_elem = 10;
    bx.m_backend.data._M_elems[0] = 0;
    bx.m_backend.data._M_elems[1] = 0;
    bx.m_backend.data._M_elems[2] = 0;
    bx.m_backend.data._M_elems[3] = 0;
    bx.m_backend.data._M_elems[4] = 0;
    bx.m_backend.data._M_elems[5] = 0;
    bx.m_backend.data._M_elems._24_5_ = 0;
    bx.m_backend.data._M_elems[7]._1_3_ = 0;
    bx.m_backend.data._M_elems._32_5_ = 0;
    bx.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&bx.m_backend,(double *)&nne,&local_898);
    c_fixed.m_backend.data._M_elems._0_8_ =
         SEXT48((base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    nne.m_backend.fpclass = cpp_dec_float_finite;
    nne.m_backend.prec_elem = 10;
    nne.m_backend.data._M_elems[0] = 0;
    nne.m_backend.data._M_elems[1] = 0;
    nne.m_backend.data._M_elems[2] = 0;
    nne.m_backend.data._M_elems[3] = 0;
    nne.m_backend.data._M_elems[4] = 0;
    nne.m_backend.data._M_elems[5] = 0;
    nne.m_backend.data._M_elems._24_5_ = 0;
    nne.m_backend.data._M_elems[7]._1_3_ = 0;
    nne.m_backend.data._M_elems._32_5_ = 0;
    nne.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&nne.m_backend,&ax.m_backend,(longlong *)&c_fixed);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_fixed.m_backend,100000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&r_fixed.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_dbl_bounded.m_backend,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&r_dbl_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_bounded.m_backend,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&r_bounded.m_backend,0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&c_free.m_backend,-10000.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&r_free.m_backend,-100000.0,(type *)0x0);
    uVar9 = (ulong)(uint)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    lVar8 = uVar9 * 0x38;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      x.m_backend.data._M_elems._0_8_ =
           (long)(base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(base->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar9 - 1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused + -1;
      n.m_backend.fpclass = cpp_dec_float_finite;
      n.m_backend.prec_elem = 10;
      n.m_backend.data._M_elems[0] = 0;
      n.m_backend.data._M_elems[1] = 0;
      n.m_backend.data._M_elems[2] = 0;
      n.m_backend.data._M_elems[3] = 0;
      n.m_backend.data._M_elems[4] = 0;
      n.m_backend.data._M_elems[5] = 0;
      n.m_backend.data._M_elems._24_5_ = 0;
      n.m_backend.data._M_elems[7]._1_3_ = 0;
      n.m_backend.data._M_elems._32_5_ = 0;
      n.m_backend.data._M_elems[9]._1_3_ = 0;
      n.m_backend.exp = 0;
      n.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                (&n.m_backend,&nne.m_backend,(longlong *)&x.m_backend);
      x.m_backend.fpclass = cpp_dec_float_finite;
      x.m_backend.prec_elem = 10;
      x.m_backend.data._M_elems[0] = 0;
      x.m_backend.data._M_elems[1] = 0;
      x.m_backend.data._M_elems[2] = 0;
      x.m_backend.data._M_elems[3] = 0;
      x.m_backend.data._M_elems[4] = 0;
      x.m_backend.data._M_elems[5] = 0;
      x.m_backend.data._M_elems._24_5_ = 0;
      x.m_backend.data._M_elems[7]._1_3_ = 0;
      x.m_backend.data._M_elems._32_5_ = 0;
      x.m_backend.data._M_elems[9]._1_3_ = 0;
      x.m_backend.exp = 0;
      x.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&x.m_backend,&ax.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_4.m_backend.fpclass = cpp_dec_float_finite;
      result_4.m_backend.prec_elem = 10;
      result_4.m_backend.data._M_elems[0] = 0;
      result_4.m_backend.data._M_elems[1] = 0;
      result_4.m_backend.data._M_elems[2] = 0;
      result_4.m_backend.data._M_elems[3] = 0;
      result_4.m_backend.data._M_elems[4] = 0;
      result_4.m_backend.data._M_elems[5] = 0;
      result_4.m_backend.data._M_elems._24_5_ = 0;
      result_4.m_backend.data._M_elems[7]._1_3_ = 0;
      result_4.m_backend.data._M_elems._32_5_ = 0;
      result_4.m_backend.data._M_elems[9]._1_3_ = 0;
      result_4.m_backend.exp = 0;
      result_4.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_4.m_backend,&bx.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .up.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 10;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems._24_5_ = 0;
      result_5.m_backend.data._M_elems[7]._1_3_ = 0;
      result_5.m_backend.data._M_elems._32_5_ = 0;
      result_5.m_backend.data._M_elems[9]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result_5.m_backend,&bx.m_backend,
                 (cpp_dec_float<50U,_int,_void> *)
                 ((long)&(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_9.m_backend,*pdVar5,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar6[-1].m_backend.data + lVar8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_9.m_backend);
      if (tVar4) {
        result_6.m_backend.fpclass = cpp_dec_float_finite;
        result_6.m_backend.prec_elem = 10;
        result_6.m_backend.data._M_elems[0] = 0;
        result_6.m_backend.data._M_elems[1] = 0;
        result_6.m_backend.data._M_elems[2] = 0;
        result_6.m_backend.data._M_elems[3] = 0;
        result_6.m_backend.data._M_elems[4] = 0;
        result_6.m_backend.data._M_elems[5] = 0;
        result_6.m_backend.data._M_elems._24_5_ = 0;
        result_6.m_backend.data._M_elems[7]._1_3_ = 0;
        result_6.m_backend.data._M_elems._32_5_ = 0;
        result_6.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_6.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .low.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&result_9.m_backend,(multiprecision *)&result_6.m_backend,arg_07);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend,&eps);
        if (tVar4) {
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&c_fixed.m_backend,&n.m_backend);
          uStack_4d0 = CONCAT35(x.m_backend.data._M_elems[7]._1_3_,x.m_backend.data._M_elems._24_5_)
          ;
          local_4e8 = (multiprecision  [8])x.m_backend.data._M_elems._0_8_;
          auStack_4e0[0] = x.m_backend.data._M_elems[2];
          auStack_4e0[1] = x.m_backend.data._M_elems[3];
          local_4d8[0] = x.m_backend.data._M_elems[4];
          local_4d8[1] = x.m_backend.data._M_elems[5];
          local_4c8 = CONCAT35(x.m_backend.data._M_elems[9]._1_3_,x.m_backend.data._M_elems._32_5_);
          local_4c0 = x.m_backend.exp;
          local_4bc = x.m_backend.neg;
          local_4b8 = x.m_backend.fpclass;
          iStack_4b4 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_8.m_backend,local_4e8,arg_08);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 10;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems._24_5_ = 0;
          result_9.m_backend.data._M_elems[7]._1_3_ = 0;
          result_9.m_backend.data._M_elems._32_5_ = 0;
          result_9.m_backend.data._M_elems[9]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_9.m_backend,&result_7.m_backend,&result_8.m_backend);
LAB_002a4b57:
          pnVar6 = (this->colWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                        result_9.m_backend.data._M_elems._32_5_);
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar2 + 2) =
               CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                        result_9.m_backend.data._M_elems._24_5_);
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_9.m_backend._48_8_;
        }
        else {
          pnVar6 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&result_9.m_backend,-*pdVar5,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar6[-1].m_backend.data + lVar8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_9.m_backend);
          if (tVar4) {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&c_dbl_bounded.m_backend,&result_5.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 10;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems._24_5_ = 0;
            result_7.m_backend.data._M_elems[7]._1_3_ = 0;
            result_7.m_backend.data._M_elems._32_5_ = 0;
            result_7.m_backend.data._M_elems[9]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_7.m_backend,&result_8.m_backend,&result_4.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 10;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems._24_5_ = 0;
            result_9.m_backend.data._M_elems[7]._1_3_ = 0;
            result_9.m_backend.data._M_elems._32_5_ = 0;
            result_9.m_backend.data._M_elems[9]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_9.m_backend,&result_7.m_backend,&n.m_backend);
            pnVar6 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
                 CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                          result_9.m_backend.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
            *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                          result_9.m_backend.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
            *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
            *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
            *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) =
                 result_9.m_backend._48_8_;
            uStack_510 = CONCAT35(result_5.m_backend.data._M_elems[7]._1_3_,
                                  result_5.m_backend.data._M_elems._24_5_);
            local_528 = (multiprecision  [8])result_5.m_backend.data._M_elems._0_8_;
            auStack_520[0] = result_5.m_backend.data._M_elems[2];
            auStack_520[1] = result_5.m_backend.data._M_elems[3];
            local_518[0] = result_5.m_backend.data._M_elems[4];
            local_518[1] = result_5.m_backend.data._M_elems[5];
            local_508 = CONCAT35(result_5.m_backend.data._M_elems[9]._1_3_,
                                 result_5.m_backend.data._M_elems._32_5_);
            local_500 = result_5.m_backend.exp;
            local_4fc = result_5.m_backend.neg;
            local_4f8 = result_5.m_backend.fpclass;
            iStack_4f4 = result_5.m_backend.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&result_9.m_backend,local_528,arg_09);
            result_5.m_backend.data._M_elems._32_5_ = result_9.m_backend.data._M_elems._32_5_;
            result_5.m_backend.data._M_elems[9]._1_3_ = result_9.m_backend.data._M_elems[9]._1_3_;
            result_5.m_backend.data._M_elems[4] = result_9.m_backend.data._M_elems[4];
            result_5.m_backend.data._M_elems[5] = result_9.m_backend.data._M_elems[5];
            result_5.m_backend.data._M_elems._24_5_ = result_9.m_backend.data._M_elems._24_5_;
            result_5.m_backend.data._M_elems[7]._1_3_ = result_9.m_backend.data._M_elems[7]._1_3_;
            result_5.m_backend.data._M_elems[0] = result_9.m_backend.data._M_elems[0];
            result_5.m_backend.data._M_elems[1] = result_9.m_backend.data._M_elems[1];
            result_5.m_backend.data._M_elems[2] = result_9.m_backend.data._M_elems[2];
            result_5.m_backend.data._M_elems[3] = result_9.m_backend.data._M_elems[3];
            result_5.m_backend.exp = result_9.m_backend.exp;
            result_5.m_backend.neg = result_9.m_backend.neg;
            result_5.m_backend.fpclass = result_9.m_backend.fpclass;
            result_5.m_backend.prec_elem = result_9.m_backend.prec_elem;
            uStack_550 = CONCAT35(result_4.m_backend.data._M_elems[7]._1_3_,
                                  result_4.m_backend.data._M_elems._24_5_);
            local_568 = (multiprecision  [8])result_4.m_backend.data._M_elems._0_8_;
            auStack_560[0] = result_4.m_backend.data._M_elems[2];
            auStack_560[1] = result_4.m_backend.data._M_elems[3];
            local_558[0] = result_4.m_backend.data._M_elems[4];
            local_558[1] = result_4.m_backend.data._M_elems[5];
            local_548 = CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,
                                 result_4.m_backend.data._M_elems._32_5_);
            local_540 = result_4.m_backend.exp;
            local_53c = result_4.m_backend.neg;
            local_538 = result_4.m_backend.fpclass;
            iStack_534 = result_4.m_backend.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&result_9.m_backend,local_568,arg_10);
            result_4.m_backend.data._M_elems._32_5_ = result_9.m_backend.data._M_elems._32_5_;
            result_4.m_backend.data._M_elems[9]._1_3_ = result_9.m_backend.data._M_elems[9]._1_3_;
            result_4.m_backend.data._M_elems[4] = result_9.m_backend.data._M_elems[4];
            result_4.m_backend.data._M_elems[5] = result_9.m_backend.data._M_elems[5];
            result_4.m_backend.data._M_elems._24_5_ = result_9.m_backend.data._M_elems._24_5_;
            result_4.m_backend.data._M_elems[7]._1_3_ = result_9.m_backend.data._M_elems[7]._1_3_;
            result_4.m_backend.data._M_elems[0] = result_9.m_backend.data._M_elems[0];
            result_4.m_backend.data._M_elems[1] = result_9.m_backend.data._M_elems[1];
            result_4.m_backend.data._M_elems[2] = result_9.m_backend.data._M_elems[2];
            result_4.m_backend.data._M_elems[3] = result_9.m_backend.data._M_elems[3];
            result_4.m_backend.exp = result_9.m_backend.exp;
            result_4.m_backend.neg = result_9.m_backend.neg;
            result_4.m_backend.fpclass = result_9.m_backend.fpclass;
            result_4.m_backend.prec_elem = result_9.m_backend.prec_elem;
            tVar4 = boost::multiprecision::operator<(&result_4,&result_5);
            pbVar3 = (this->colUp).data;
            if (tVar4) {
              pbVar3[uVar9 - 1] = true;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        ((cpp_dec_float<50U,_int,_void> *)
                         ((long)&(this->colWeight).data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar8),&x.m_backend);
            }
            else {
              pbVar3[uVar9 - 1] = false;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        ((cpp_dec_float<50U,_int,_void> *)
                         ((long)&(this->colWeight).data.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                         lVar8),&x.m_backend);
            }
          }
          else {
            result_8.m_backend.fpclass = cpp_dec_float_finite;
            result_8.m_backend.prec_elem = 10;
            result_8.m_backend.data._M_elems[0] = 0;
            result_8.m_backend.data._M_elems[1] = 0;
            result_8.m_backend.data._M_elems[2] = 0;
            result_8.m_backend.data._M_elems[3] = 0;
            result_8.m_backend.data._M_elems[4] = 0;
            result_8.m_backend.data._M_elems[5] = 0;
            result_8.m_backend.data._M_elems._24_5_ = 0;
            result_8.m_backend.data._M_elems[7]._1_3_ = 0;
            result_8.m_backend.data._M_elems._32_5_ = 0;
            result_8.m_backend._37_8_ = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_8.m_backend,&c_bounded.m_backend,&result_4.m_backend);
            result_7.m_backend.fpclass = cpp_dec_float_finite;
            result_7.m_backend.prec_elem = 10;
            result_7.m_backend.data._M_elems[0] = 0;
            result_7.m_backend.data._M_elems[1] = 0;
            result_7.m_backend.data._M_elems[2] = 0;
            result_7.m_backend.data._M_elems[3] = 0;
            result_7.m_backend.data._M_elems[4] = 0;
            result_7.m_backend.data._M_elems[5] = 0;
            result_7.m_backend.data._M_elems._24_5_ = 0;
            result_7.m_backend.data._M_elems[7]._1_3_ = 0;
            result_7.m_backend.data._M_elems._32_5_ = 0;
            result_7.m_backend.data._M_elems[9]._1_3_ = 0;
            result_7.m_backend.exp = 0;
            result_7.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_7.m_backend,&result_8.m_backend,&x.m_backend);
            result_9.m_backend.fpclass = cpp_dec_float_finite;
            result_9.m_backend.prec_elem = 10;
            result_9.m_backend.data._M_elems[0] = 0;
            result_9.m_backend.data._M_elems[1] = 0;
            result_9.m_backend.data._M_elems[2] = 0;
            result_9.m_backend.data._M_elems[3] = 0;
            result_9.m_backend.data._M_elems[4] = 0;
            result_9.m_backend.data._M_elems[5] = 0;
            result_9.m_backend.data._M_elems._24_5_ = 0;
            result_9.m_backend.data._M_elems[7]._1_3_ = 0;
            result_9.m_backend.data._M_elems._32_5_ = 0;
            result_9.m_backend.data._M_elems[9]._1_3_ = 0;
            result_9.m_backend.exp = 0;
            result_9.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_9.m_backend,&result_7.m_backend,&n.m_backend);
            pnVar6 = (this->colWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
                 CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                          result_9.m_backend.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
            *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                          result_9.m_backend.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
            *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
            *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
            *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) =
                 result_9.m_backend._48_8_;
            (this->colUp).data[uVar9 - 1] = true;
          }
        }
      }
      else {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_9.m_backend,-*pdVar5,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar6[-1].m_backend.data + lVar8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_9.m_backend);
        if (!tVar4) {
          result_7.m_backend.fpclass = cpp_dec_float_finite;
          result_7.m_backend.prec_elem = 10;
          result_7.m_backend.data._M_elems[0] = 0;
          result_7.m_backend.data._M_elems[1] = 0;
          result_7.m_backend.data._M_elems[2] = 0;
          result_7.m_backend.data._M_elems[3] = 0;
          result_7.m_backend.data._M_elems[4] = 0;
          result_7.m_backend.data._M_elems[5] = 0;
          result_7.m_backend.data._M_elems._24_5_ = 0;
          result_7.m_backend.data._M_elems[7]._1_3_ = 0;
          result_7.m_backend.data._M_elems._32_5_ = 0;
          result_7.m_backend.data._M_elems[9]._1_3_ = 0;
          result_7.m_backend.exp = 0;
          result_7.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_7.m_backend,&c_free.m_backend,&n.m_backend);
          uStack_590 = CONCAT35(x.m_backend.data._M_elems[7]._1_3_,x.m_backend.data._M_elems._24_5_)
          ;
          local_5a8 = (multiprecision  [8])x.m_backend.data._M_elems._0_8_;
          auStack_5a0[0] = x.m_backend.data._M_elems[2];
          auStack_5a0[1] = x.m_backend.data._M_elems[3];
          local_598[0] = x.m_backend.data._M_elems[4];
          local_598[1] = x.m_backend.data._M_elems[5];
          local_588 = CONCAT35(x.m_backend.data._M_elems[9]._1_3_,x.m_backend.data._M_elems._32_5_);
          local_580 = x.m_backend.exp;
          local_57c = x.m_backend.neg;
          local_578 = x.m_backend.fpclass;
          iStack_574 = x.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((type *)&result_8.m_backend,local_5a8,arg_11);
          result_9.m_backend.fpclass = cpp_dec_float_finite;
          result_9.m_backend.prec_elem = 10;
          result_9.m_backend.data._M_elems[0] = 0;
          result_9.m_backend.data._M_elems[1] = 0;
          result_9.m_backend.data._M_elems[2] = 0;
          result_9.m_backend.data._M_elems[3] = 0;
          result_9.m_backend.data._M_elems[4] = 0;
          result_9.m_backend.data._M_elems[5] = 0;
          result_9.m_backend.data._M_elems._24_5_ = 0;
          result_9.m_backend.data._M_elems[7]._1_3_ = 0;
          result_9.m_backend.data._M_elems._32_5_ = 0;
          result_9.m_backend.data._M_elems[9]._1_3_ = 0;
          result_9.m_backend.exp = 0;
          result_9.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&result_9.m_backend,&result_7.m_backend,&result_8.m_backend);
          goto LAB_002a4b57;
        }
        result_8.m_backend.fpclass = cpp_dec_float_finite;
        result_8.m_backend.prec_elem = 10;
        result_8.m_backend.data._M_elems[0] = 0;
        result_8.m_backend.data._M_elems[1] = 0;
        result_8.m_backend.data._M_elems[2] = 0;
        result_8.m_backend.data._M_elems[3] = 0;
        result_8.m_backend.data._M_elems[4] = 0;
        result_8.m_backend.data._M_elems[5] = 0;
        result_8.m_backend.data._M_elems._24_5_ = 0;
        result_8.m_backend.data._M_elems[7]._1_3_ = 0;
        result_8.m_backend.data._M_elems._32_5_ = 0;
        result_8.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_8.m_backend,&c_bounded.m_backend,&result_5.m_backend);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 10;
        result_7.m_backend.data._M_elems[0] = 0;
        result_7.m_backend.data._M_elems[1] = 0;
        result_7.m_backend.data._M_elems[2] = 0;
        result_7.m_backend.data._M_elems[3] = 0;
        result_7.m_backend.data._M_elems[4] = 0;
        result_7.m_backend.data._M_elems[5] = 0;
        result_7.m_backend.data._M_elems._24_5_ = 0;
        result_7.m_backend.data._M_elems[7]._1_3_ = 0;
        result_7.m_backend.data._M_elems._32_5_ = 0;
        result_7.m_backend.data._M_elems[9]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_7.m_backend,&result_8.m_backend,&n.m_backend);
        result_9.m_backend.fpclass = cpp_dec_float_finite;
        result_9.m_backend.prec_elem = 10;
        result_9.m_backend.data._M_elems[0] = 0;
        result_9.m_backend.data._M_elems[1] = 0;
        result_9.m_backend.data._M_elems[2] = 0;
        result_9.m_backend.data._M_elems[3] = 0;
        result_9.m_backend.data._M_elems[4] = 0;
        result_9.m_backend.data._M_elems[5] = 0;
        result_9.m_backend.data._M_elems._24_5_ = 0;
        result_9.m_backend.data._M_elems[7]._1_3_ = 0;
        result_9.m_backend.data._M_elems._32_5_ = 0;
        result_9.m_backend.data._M_elems[9]._1_3_ = 0;
        result_9.m_backend.exp = 0;
        result_9.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_9.m_backend,&result_7.m_backend,&x.m_backend);
        pnVar6 = (this->colWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
             CONCAT35(result_9.m_backend.data._M_elems[9]._1_3_,
                      result_9.m_backend.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
        *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result_9.m_backend.data._M_elems[7]._1_3_,
                      result_9.m_backend.data._M_elems._24_5_);
        puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
        *(undefined8 *)puVar2 = result_9.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = result_9.m_backend.data._M_elems._8_8_;
        *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_9.m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_9.m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = result_9.m_backend._48_8_;
        (this->colUp).data[uVar9 - 1] = false;
      }
      lVar8 = lVar8 + -0x38;
    }
    uVar9 = (ulong)(uint)(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    lVar8 = uVar9 * 0x38;
    for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
      pnVar6 = (base->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&n.m_backend,*pdVar5,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)((long)&pnVar6[-1].m_backend.data + lVar8),
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&n.m_backend);
      if (tVar4) {
        result_15.m_backend.fpclass = cpp_dec_float_finite;
        result_15.m_backend.prec_elem = 10;
        result_15.m_backend.data._M_elems[0] = 0;
        result_15.m_backend.data._M_elems[1] = 0;
        result_15.m_backend.data._M_elems[2] = 0;
        result_15.m_backend.data._M_elems[3] = 0;
        result_15.m_backend.data._M_elems[4] = 0;
        result_15.m_backend.data._M_elems[5] = 0;
        result_15.m_backend.data._M_elems._24_5_ = 0;
        result_15.m_backend.data._M_elems[7]._1_3_ = 0;
        result_15.m_backend.data._M_elems._32_5_ = 0;
        result_15.m_backend._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&result_15.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8),
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((type *)&n.m_backend,(multiprecision *)&result_15.m_backend,arg_12);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&n.m_backend,&eps);
        if (tVar4) {
          pnVar6 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               r_fixed.m_backend.data._M_elems._32_8_;
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = r_fixed.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = r_fixed.m_backend.data._M_elems._24_8_;
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = r_fixed.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = r_fixed.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = r_fixed.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = r_fixed.m_backend.neg;
          uVar7 = r_fixed.m_backend._48_8_;
LAB_002a51d5:
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = uVar7;
        }
        else {
          pnVar6 = (base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&n.m_backend,-*pdVar5,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)((long)&pnVar6[-1].m_backend.data + lVar8),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&n.m_backend);
          if (tVar4) {
            n.m_backend.fpclass = cpp_dec_float_finite;
            n.m_backend.prec_elem = 10;
            n.m_backend.data._M_elems[0] = 0;
            n.m_backend.data._M_elems[1] = 0;
            n.m_backend.data._M_elems[2] = 0;
            n.m_backend.data._M_elems[3] = 0;
            n.m_backend.data._M_elems[4] = 0;
            n.m_backend.data._M_elems[5] = 0;
            n.m_backend.data._M_elems._24_5_ = 0;
            n.m_backend.data._M_elems[7]._1_3_ = 0;
            n.m_backend.data._M_elems._32_5_ = 0;
            n.m_backend.data._M_elems[9]._1_3_ = 0;
            n.m_backend.exp = 0;
            n.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&n.m_backend,&bx.m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .right.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8)
                      );
            x.m_backend.fpclass = cpp_dec_float_finite;
            x.m_backend.prec_elem = 10;
            x.m_backend.data._M_elems[0] = 0;
            x.m_backend.data._M_elems[1] = 0;
            x.m_backend.data._M_elems[2] = 0;
            x.m_backend.data._M_elems[3] = 0;
            x.m_backend.data._M_elems[4] = 0;
            x.m_backend.data._M_elems[5] = 0;
            x.m_backend.data._M_elems._24_5_ = 0;
            x.m_backend.data._M_elems[7]._1_3_ = 0;
            x.m_backend.data._M_elems._32_5_ = 0;
            x.m_backend.data._M_elems[9]._1_3_ = 0;
            x.m_backend.exp = 0;
            x.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&x.m_backend,&bx.m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .left.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8)
                      );
            result_5.m_backend.fpclass = cpp_dec_float_finite;
            result_5.m_backend.prec_elem = 10;
            result_5.m_backend.data._M_elems[0] = 0;
            result_5.m_backend.data._M_elems[1] = 0;
            result_5.m_backend.data._M_elems[2] = 0;
            result_5.m_backend.data._M_elems[3] = 0;
            result_5.m_backend.data._M_elems[4] = 0;
            result_5.m_backend.data._M_elems[5] = 0;
            result_5.m_backend.data._M_elems._24_5_ = 0;
            result_5.m_backend.data._M_elems[7]._1_3_ = 0;
            result_5.m_backend.data._M_elems._32_5_ = 0;
            result_5.m_backend.data._M_elems[9]._1_3_ = 0;
            result_5.m_backend.exp = 0;
            result_5.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_5.m_backend,&r_dbl_bounded.m_backend,&x.m_backend);
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 10;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems._24_5_ = 0;
            result_4.m_backend.data._M_elems[7]._1_3_ = 0;
            result_4.m_backend.data._M_elems._32_5_ = 0;
            result_4.m_backend.data._M_elems[9]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_4.m_backend,&result_5.m_backend,&n.m_backend);
            pnVar6 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
                 CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,
                          result_4.m_backend.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
            *(undefined8 *)puVar2 = result_4.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(result_4.m_backend.data._M_elems[7]._1_3_,
                          result_4.m_backend.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
            *(undefined8 *)puVar2 = result_4.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = result_4.m_backend.data._M_elems._8_8_;
            *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = result_4.m_backend.exp;
            *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = result_4.m_backend.neg;
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) =
                 result_4.m_backend._48_8_;
            uStack_5d0 = CONCAT35(n.m_backend.data._M_elems[7]._1_3_,
                                  n.m_backend.data._M_elems._24_5_);
            local_5e8 = (multiprecision  [8])n.m_backend.data._M_elems._0_8_;
            auStack_5e0[0] = n.m_backend.data._M_elems[2];
            auStack_5e0[1] = n.m_backend.data._M_elems[3];
            local_5d8[0] = n.m_backend.data._M_elems[4];
            local_5d8[1] = n.m_backend.data._M_elems[5];
            local_5c8 = CONCAT35(n.m_backend.data._M_elems[9]._1_3_,n.m_backend.data._M_elems._32_5_
                                );
            local_5c0 = n.m_backend.exp;
            local_5bc = n.m_backend.neg;
            local_5b8 = n.m_backend.fpclass;
            iStack_5b4 = n.m_backend.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&result_4,local_5e8,arg_13);
            uStack_610 = CONCAT35(x.m_backend.data._M_elems[7]._1_3_,
                                  x.m_backend.data._M_elems._24_5_);
            local_628 = (multiprecision  [8])x.m_backend.data._M_elems._0_8_;
            auStack_620[0] = x.m_backend.data._M_elems[2];
            auStack_620[1] = x.m_backend.data._M_elems[3];
            local_618[0] = x.m_backend.data._M_elems[4];
            local_618[1] = x.m_backend.data._M_elems[5];
            local_608 = CONCAT35(x.m_backend.data._M_elems[9]._1_3_,x.m_backend.data._M_elems._32_5_
                                );
            local_600 = x.m_backend.exp;
            local_5fc = x.m_backend.neg;
            local_5f8 = x.m_backend.fpclass;
            iStack_5f4 = x.m_backend.prec_elem;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&result_5.m_backend,local_628,arg_14);
            tVar4 = boost::multiprecision::operator<
                              (&result_4,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_5.m_backend);
            (this->rowRight).data[uVar9 - 1] = tVar4;
          }
          else {
            x.m_backend.fpclass = cpp_dec_float_finite;
            x.m_backend.prec_elem = 10;
            x.m_backend.data._M_elems[0] = 0;
            x.m_backend.data._M_elems[1] = 0;
            x.m_backend.data._M_elems[2] = 0;
            x.m_backend.data._M_elems[3] = 0;
            x.m_backend.data._M_elems[4] = 0;
            x.m_backend.data._M_elems[5] = 0;
            x.m_backend.data._M_elems._24_5_ = 0;
            x.m_backend.data._M_elems[7]._1_3_ = 0;
            x.m_backend.data._M_elems._32_5_ = 0;
            x.m_backend.data._M_elems[9]._1_3_ = 0;
            x.m_backend.exp = 0;
            x.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&x.m_backend,&bx.m_backend,
                       (cpp_dec_float<50U,_int,_void> *)
                       ((long)&(base->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .right.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8)
                      );
            n.m_backend.fpclass = cpp_dec_float_finite;
            n.m_backend.prec_elem = 10;
            n.m_backend.data._M_elems[0] = 0;
            n.m_backend.data._M_elems[1] = 0;
            n.m_backend.data._M_elems[2] = 0;
            n.m_backend.data._M_elems[3] = 0;
            n.m_backend.data._M_elems[4] = 0;
            n.m_backend.data._M_elems[5] = 0;
            n.m_backend.data._M_elems._24_5_ = 0;
            n.m_backend.data._M_elems[7]._1_3_ = 0;
            n.m_backend.data._M_elems._32_5_ = 0;
            n.m_backend.data._M_elems[9]._1_3_ = 0;
            n.m_backend.exp = 0;
            n.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&n.m_backend,&r_bounded.m_backend,&x.m_backend);
            pnVar6 = (this->rowWeight).data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
                 CONCAT35(n.m_backend.data._M_elems[9]._1_3_,n.m_backend.data._M_elems._32_5_);
            puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
            *(undefined8 *)puVar2 = n.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT35(n.m_backend.data._M_elems[7]._1_3_,n.m_backend.data._M_elems._24_5_);
            puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
            *(undefined8 *)puVar2 = n.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = n.m_backend.data._M_elems._8_8_;
            *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = n.m_backend.exp;
            *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = n.m_backend.neg;
            *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = n.m_backend._48_8_;
            (this->rowRight).data[uVar9 - 1] = true;
          }
        }
      }
      else {
        pnVar6 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&n.m_backend,-*pdVar5,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)((long)&pnVar6[-1].m_backend.data + lVar8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&n.m_backend);
        if (!tVar4) {
          pnVar6 = (this->rowWeight).data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
               r_free.m_backend.data._M_elems._32_8_;
          puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
          *(undefined8 *)puVar2 = r_free.m_backend.data._M_elems._16_8_;
          *(undefined8 *)(puVar2 + 2) = r_free.m_backend.data._M_elems._24_8_;
          puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
          *(undefined8 *)puVar2 = r_free.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(puVar2 + 2) = r_free.m_backend.data._M_elems._8_8_;
          *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = r_free.m_backend.exp;
          *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = r_free.m_backend.neg;
          uVar7 = r_free.m_backend._48_8_;
          goto LAB_002a51d5;
        }
        x.m_backend.fpclass = cpp_dec_float_finite;
        x.m_backend.prec_elem = 10;
        x.m_backend.data._M_elems[0] = 0;
        x.m_backend.data._M_elems[1] = 0;
        x.m_backend.data._M_elems[2] = 0;
        x.m_backend.data._M_elems[3] = 0;
        x.m_backend.data._M_elems[4] = 0;
        x.m_backend.data._M_elems[5] = 0;
        x.m_backend.data._M_elems._24_5_ = 0;
        x.m_backend.data._M_elems[7]._1_3_ = 0;
        x.m_backend.data._M_elems._32_5_ = 0;
        x.m_backend.data._M_elems[9]._1_3_ = 0;
        x.m_backend.exp = 0;
        x.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&x.m_backend,&bx.m_backend,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)&(base->
                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .left.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar8));
        n.m_backend.fpclass = cpp_dec_float_finite;
        n.m_backend.prec_elem = 10;
        n.m_backend.data._M_elems[0] = 0;
        n.m_backend.data._M_elems[1] = 0;
        n.m_backend.data._M_elems[2] = 0;
        n.m_backend.data._M_elems[3] = 0;
        n.m_backend.data._M_elems[4] = 0;
        n.m_backend.data._M_elems[5] = 0;
        n.m_backend.data._M_elems._24_5_ = 0;
        n.m_backend.data._M_elems[7]._1_3_ = 0;
        n.m_backend.data._M_elems._32_5_ = 0;
        n.m_backend.data._M_elems[9]._1_3_ = 0;
        n.m_backend.exp = 0;
        n.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&n.m_backend,&r_bounded.m_backend,&x.m_backend);
        pnVar6 = (this->rowWeight).data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)&(pnVar6->m_backend).data + lVar8 + -0x18) =
             CONCAT35(n.m_backend.data._M_elems[9]._1_3_,n.m_backend.data._M_elems._32_5_);
        puVar2 = (uint *)((long)&(pnVar6->m_backend).data + lVar8 + -0x28);
        *(undefined8 *)puVar2 = n.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(n.m_backend.data._M_elems[7]._1_3_,n.m_backend.data._M_elems._24_5_);
        puVar2 = (uint *)((long)&pnVar6[-1].m_backend.data + lVar8);
        *(undefined8 *)puVar2 = n.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(puVar2 + 2) = n.m_backend.data._M_elems._8_8_;
        *(int *)((long)&(pnVar6->m_backend).data + lVar8 + -0x10) = n.m_backend.exp;
        *(bool *)((long)&(pnVar6->m_backend).data + lVar8 + -0xc) = n.m_backend.neg;
        *(undefined8 *)((long)&(pnVar6->m_backend).data + lVar8 + -8) = n.m_backend._48_8_;
        (this->rowRight).data[uVar9 - 1] = false;
      }
      lVar8 = lVar8 + -0x38;
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}